

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

void helper_msa_st_b_mips(CPUMIPSState *env,uint32_t wd,target_ulong_conflict addr)

{
  uint mmu_idx;
  TCGMemOpIdx oi;
  long lVar1;
  uintptr_t unaff_retaddr;
  
  lVar1 = (ulong)wd * 0x10;
  mmu_idx = 3;
  if ((env->hflags >> 0x1c & 1) == 0) {
    mmu_idx = env->hflags & 3;
  }
  oi = mmu_idx + 0x780;
  ensure_writable_pages(env,addr,mmu_idx,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr,*(uint8_t *)((env->active_fpu).fpr + wd),oi,
             unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 1,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar1 + 1),oi,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 2,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar1 + 2),oi,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 3,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar1 + 3),oi,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 4,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar1 + 4),oi,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 5,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar1 + 5),oi,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 6,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar1 + 6),oi,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 7,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar1 + 7),oi,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 8,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar1 + 8),oi,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 9,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar1 + 9),oi,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 10,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar1 + 10),oi,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 0xb,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar1 + 0xb),oi,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 0xc,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar1 + 0xc),oi,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 0xd,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar1 + 0xd),oi,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 0xe,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar1 + 0xe),oi,unaff_retaddr);
  helper_ret_stb_mmu_mips
            ((CPUArchState_conflict5 *)env,addr + 0xf,
             *(uint8_t *)((long)(env->active_fpu).fpr + lVar1 + 0xf),oi,unaff_retaddr);
  return;
}

Assistant:

void helper_msa_st_b(CPUMIPSState *env, uint32_t wd,
                     target_ulong addr)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    int mmu_idx = cpu_mmu_index(env, false);

    MEMOP_IDX(DF_BYTE)
    ensure_writable_pages(env, addr, mmu_idx, GETPC());
#if !defined(HOST_WORDS_BIGENDIAN)
    helper_ret_stb_mmu(env, addr + (0  << DF_BYTE), pwd->b[0],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (1  << DF_BYTE), pwd->b[1],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (2  << DF_BYTE), pwd->b[2],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (3  << DF_BYTE), pwd->b[3],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (4  << DF_BYTE), pwd->b[4],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (5  << DF_BYTE), pwd->b[5],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (6  << DF_BYTE), pwd->b[6],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (7  << DF_BYTE), pwd->b[7],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (8  << DF_BYTE), pwd->b[8],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (9  << DF_BYTE), pwd->b[9],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (10 << DF_BYTE), pwd->b[10], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (11 << DF_BYTE), pwd->b[11], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (12 << DF_BYTE), pwd->b[12], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (13 << DF_BYTE), pwd->b[13], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (14 << DF_BYTE), pwd->b[14], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (15 << DF_BYTE), pwd->b[15], oi, GETPC());
#else
    helper_ret_stb_mmu(env, addr + (7  << DF_BYTE), pwd->b[0],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (6  << DF_BYTE), pwd->b[1],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (5  << DF_BYTE), pwd->b[2],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (4  << DF_BYTE), pwd->b[3],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (3  << DF_BYTE), pwd->b[4],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (2  << DF_BYTE), pwd->b[5],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (1  << DF_BYTE), pwd->b[6],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (0  << DF_BYTE), pwd->b[7],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (15 << DF_BYTE), pwd->b[8],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (14 << DF_BYTE), pwd->b[9],  oi, GETPC());
    helper_ret_stb_mmu(env, addr + (13 << DF_BYTE), pwd->b[10], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (12 << DF_BYTE), pwd->b[11], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (11 << DF_BYTE), pwd->b[12], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (10 << DF_BYTE), pwd->b[13], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (9  << DF_BYTE), pwd->b[14], oi, GETPC());
    helper_ret_stb_mmu(env, addr + (8  << DF_BYTE), pwd->b[15], oi, GETPC());
#endif
}